

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner-common.c
# Opt level: O0

void process_files(GSList *files,scan_opts *opts)

{
  GThreadPool *pGVar1;
  int iVar2;
  int local_2c;
  undefined8 uStack_28;
  int started;
  GThread *progress_bar_thread;
  GThreadPool *pool;
  scan_opts *opts_local;
  GSList *files_local;
  
  local_2c = 0;
  pool = (GThreadPool *)opts;
  opts_local = (scan_opts *)files;
  g_mutex_lock(&progress_mutex);
  uStack_28 = g_thread_new(0,print_progress_bar,&local_2c);
  while (local_2c == 0) {
    g_cond_wait(&progress_cond,&progress_mutex);
  }
  g_mutex_unlock(&progress_mutex);
  pGVar1 = pool;
  iVar2 = nproc();
  progress_bar_thread = (GThread *)g_thread_pool_new(init_state_and_scan_work_item,pGVar1,iVar2,0,0)
  ;
  g_slist_foreach(opts_local,init_state_and_scan,progress_bar_thread);
  g_thread_pool_free(progress_bar_thread,0,1);
  g_thread_join(uStack_28);
  return;
}

Assistant:

void
process_files(GSList *files, struct scan_opts *opts)
{
	GThreadPool *pool;
	GThread *progress_bar_thread;

	int started = 0;

	// Start the progress bar thread. It misuses progress_mutex and
	// progress_cond to signal when it is ready.
	g_mutex_lock(&progress_mutex);
	progress_bar_thread = g_thread_new(NULL, print_progress_bar, &started);
	while (!started) {
		g_cond_wait(&progress_cond, &progress_mutex);
	}
	g_mutex_unlock(&progress_mutex);

	pool = g_thread_pool_new((GFunc)init_state_and_scan_work_item, opts,
	    nproc(), FALSE, NULL);
	g_slist_foreach(files, (GFunc)init_state_and_scan, pool);
	g_thread_pool_free(pool, FALSE, TRUE);
	g_thread_join(progress_bar_thread);
}